

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::swap(sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *this,sparse_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *ht)

{
  size_type sVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  size_type sVar6;
  size_type sVar7;
  float fVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  Settings __tmp;
  
  iVar23 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.id_;
  iVar24 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.num_hashes_;
  uVar2 = *(undefined8 *)
           &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
  sVar3 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar4 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar16 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           enlarge_factor_;
  fVar17 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  bVar18 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           consider_shrink_;
  bVar19 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_empty_;
  bVar20 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_deleted_;
  uVar21 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           field_0x2b;
  uVar22 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           num_ht_copies_;
  iVar14 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.id_;
  iVar15 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.num_hashes_;
  uVar5 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
  sVar6 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar7 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar8 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          shrink_factor_;
  bVar9 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          consider_shrink_;
  bVar10 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_empty_;
  bVar11 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_deleted_;
  uVar12 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           field_0x2b;
  uVar13 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_factor_
       = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
         enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
       fVar8;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_
       = bVar9;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_ =
       bVar10;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_deleted_ =
       bVar11;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.field_0x2b =
       uVar12;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.num_ht_copies_ =
       uVar13;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = sVar6;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = sVar7;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.id_
       = iVar14;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar15;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar5;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
       fVar16;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
       fVar17;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       bVar18;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_ =
       bVar19;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_deleted_ =
       bVar20;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.field_0x2b =
       uVar21;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.num_ht_copies_ =
       uVar22;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_threshold_
       = sVar3;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_threshold_
       = sVar4;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ =
       iVar23;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar24;
  *(undefined8 *)
   &(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar2;
  iVar15 = (this->key_info).super_Hasher.id_;
  iVar23 = (this->key_info).super_Hasher.num_hashes_;
  uVar2 = *(undefined8 *)&(this->key_info).super_Hasher.num_compares_;
  iVar14 = (ht->key_info).super_Hasher.num_hashes_;
  uVar5 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar14;
  *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar5;
  (ht->key_info).super_Hasher.id_ = iVar15;
  (ht->key_info).super_Hasher.num_hashes_ = iVar23;
  *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_ = uVar2;
  sVar1 = this->num_deleted;
  this->num_deleted = ht->num_deleted;
  ht->num_deleted = sVar1;
  sparsetable<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::swap(&this->table,&ht->table);
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)this,
             (this->table).settings.table_size);
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)ht,
             (ht->table).settings.table_size);
  return;
}

Assistant:

void swap(sparse_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    table.swap(ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }